

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkVertexInputAttributeDescription * __thiscall
Fossilize::StateRecorder::Impl::copy<VkVertexInputAttributeDescription>
          (Impl *this,VkVertexInputAttributeDescription *src,size_t count,ScratchAllocator *alloc)

{
  VkVertexInputAttributeDescription *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkVertexInputAttributeDescription>(alloc,count);
    if (pVVar1 != (VkVertexInputAttributeDescription *)0x0) {
      pVVar1 = (VkVertexInputAttributeDescription *)memmove(pVVar1,src,count << 4);
      return pVVar1;
    }
  }
  return (VkVertexInputAttributeDescription *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}